

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

bool __thiscall absl::lts_20250127::Mutex::AwaitCommon(Mutex *this,Condition *cond,KernelTimeout t)

{
  bool bVar1;
  bool bVar2;
  undefined1 *puVar3;
  SynchWaitParams waitp;
  
  AssertReaderHeld(this);
  bVar1 = (*cond->eval_)(cond);
  bVar2 = true;
  if (!bVar1) {
    puVar3 = kExclusiveS;
    if (((this->mu_).super___atomic_base<long>._M_i & 8U) == 0) {
      puVar3 = kSharedS;
    }
    waitp.thread = &synchronization_internal::GetOrCreateCurrentThreadIdentity()->per_thread_synch;
    waitp.cvmu = (Mutex *)0x0;
    waitp.cv_word = (atomic<long> *)0x0;
    waitp.how = (MuHow)puVar3;
    waitp.cond = cond;
    waitp.timeout.rep_ = t.rep_;
    waitp.contention_start_cycles = base_internal::CycleClock::Now();
    waitp.should_submit_contention_data = false;
    UnlockSlow(this,&waitp);
    Block(this,waitp.thread);
    LockSlowLoop(this,&waitp,3);
    bVar2 = true;
    if (waitp.cond == (Condition *)0x0) {
      bVar1 = (*cond->eval_)(cond);
      if (!bVar1) {
        if (t.rep_ == 0xffffffffffffffff) {
          raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x645,"Check %s failed: %s","res || t.has_timeout()",
                     "condition untrue on return from Await");
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x645,"bool absl::Mutex::AwaitCommon(const Condition &, KernelTimeout)");
        }
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

bool Mutex::AwaitCommon(const Condition& cond, KernelTimeout t) {
  if (kDebugMode) {
    this->AssertReaderHeld();
  }
  if (cond.Eval()) {  // condition already true; nothing to do
    return true;
  }
  MuHow how =
      (mu_.load(std::memory_order_relaxed) & kMuWriter) ? kExclusive : kShared;
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, TsanFlags(how));
  SynchWaitParams waitp(how, &cond, t, nullptr /*no cvmu*/,
                        Synch_GetPerThreadAnnotated(this),
                        nullptr /*no cv_word*/);
  this->UnlockSlow(&waitp);
  this->Block(waitp.thread);
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, TsanFlags(how));
  ABSL_TSAN_MUTEX_PRE_LOCK(this, TsanFlags(how));
  this->LockSlowLoop(&waitp, kMuHasBlocked | kMuIsCond);
  bool res = waitp.cond != nullptr ||  // => cond known true from LockSlowLoop
             EvalConditionAnnotated(&cond, this, true, false, how == kShared);
  ABSL_TSAN_MUTEX_POST_LOCK(this, TsanFlags(how), 0);
  ABSL_RAW_CHECK(res || t.has_timeout(),
                 "condition untrue on return from Await");
  return res;
}